

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O1

uchar * mcmlck(mcmcxdef *ctx,mcmon objnum)

{
  ushort uVar1;
  mcmodef *pmVar2;
  ulong uVar3;
  uchar *puVar4;
  undefined8 *puVar5;
  undefined6 in_register_00000032;
  
  uVar1 = ctx->mcmcxmtb[CONCAT62(in_register_00000032,objnum) >> 8 & 0xffffff]
          [(uint)CONCAT62(in_register_00000032,objnum) & 0xff];
  if (uVar1 != 0xffff) {
    pmVar2 = ctx->mcmcxgl->mcmcxtab[uVar1 >> 8];
    uVar3 = (ulong)((uVar1 & 0xff) << 5);
    uVar1 = *(ushort *)((long)&pmVar2->mcmoflg + uVar3);
    if ((uVar1 & 0x80) == 0) {
      if ((uVar1 & 8) == 0) {
        puVar4 = mcmload(ctx,objnum);
        return puVar4;
      }
      puVar5 = (undefined8 *)((long)&pmVar2->mcmoptr + uVar3);
      *(ushort *)((long)puVar5 + 0x14) = uVar1 | 4;
      *(char *)((long)puVar5 + 0x16) = *(char *)((long)puVar5 + 0x16) + '\x01';
      return (uchar *)*puVar5;
    }
  }
  errsigf(ctx->mcmcxgl->mcmcxerr,"TADS",0x11);
}

Assistant:

uchar *mcmlck(mcmcxdef *ctx, mcmon objnum)
{
    mcmodef *o = mcmobje(ctx, objnum);

    if ((o->mcmoflg & MCMOFFREE) != 0 || mcmc2g(ctx, objnum) == MCMONINV)
    {
        errsig(ctx->mcmcxgl->mcmcxerr, ERR_INVOBJ);
        return 0;
    }
    else if (o->mcmoflg & MCMOFPRES)
    {
        o->mcmoflg |= MCMOFLOCK;
        ++(o->mcmolcnt);
        return(o->mcmoptr);
    }
    else
        return(mcmload(ctx, objnum));
}